

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::startLoopImpl(Connection *this)

{
  SourceLocation location;
  SourceLocation local_40;
  Connection *this_local;
  
  this_local = this;
  loop((Connection *)&stack0xffffffffffffffe0);
  SourceLocation::SourceLocation
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"startLoopImpl",0x1cf1,0xc);
  location.function = local_40.function;
  location.fileName = local_40.fileName;
  location.lineNumber = local_40.lineNumber;
  location.columnNumber = local_40.columnNumber;
  Promise<kj::HttpServer::Connection::LoopResult>::
  catch_<kj::HttpServer::Connection::startLoopImpl()::_lambda(kj::Exception&&)_1_>
            ((Promise<kj::HttpServer::Connection::LoopResult> *)this,
             (Type *)&stack0xffffffffffffffe0,location);
  Promise<kj::HttpServer::Connection::LoopResult>::~Promise
            ((Promise<kj::HttpServer::Connection::LoopResult> *)&stack0xffffffffffffffe0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<LoopResult> startLoopImpl() {
    return loop().catch_([this](kj::Exception&& e) {
      // Exception; report 5xx.

      KJ_IF_SOME(p, webSocketError) {
        // sendWebSocketError() was called. Finish sending and close the connection. Don't log
        // the exception because it's probably a side-effect of this.
        auto promise = kj::mv(p);
        webSocketError = kj::none;
        return kj::mv(promise);
      }

      KJ_IF_SOME(p, tunnelRejected) {
        // reject() was called to reject a CONNECT request. Finish sending and close the connection.
        // Don't log the exception because it's probably a side-effect of this.
        auto promise = kj::mv(p);
        tunnelRejected = kj::none;
        return kj::mv(promise);
      }

      return sendError(kj::mv(e));
    });
  }